

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_data_converter_init_preallocated
                    (ma_data_converter_config *pConfig,void *pHeap,ma_data_converter *pConverter)

{
  ma_bool8 mVar1;
  ma_bool8 mVar2;
  ma_uint32 mVar3;
  ma_uint32 mVar4;
  ma_bool32 mVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  uint uVar10;
  ma_resampling_backend_vtable *pmVar11;
  void *pvVar12;
  ma_result mVar13;
  ma_format mVar14;
  ma_data_converter_heap_layout heapLayout;
  ma_channel_converter_config channelConverterConfig;
  ma_data_converter_heap_layout local_90;
  undefined8 local_78;
  undefined8 uStack_70;
  ma_resampler_config local_60;
  
  if (pConverter == (ma_data_converter *)0x0) {
    return MA_INVALID_ARGS;
  }
  memset(pConverter,0,0x138);
  mVar13 = ma_data_converter_get_heap_layout(pConfig,&local_90);
  if (mVar13 != MA_SUCCESS) {
    return mVar13;
  }
  pConverter->_pHeap = pHeap;
  if (local_90.sizeInBytes != 0 && pHeap != (void *)0x0) {
    memset(pHeap,0,local_90.sizeInBytes);
  }
  local_78._0_4_ = pConfig->formatIn;
  local_78._4_4_ = pConfig->formatOut;
  uStack_70._0_4_ = pConfig->channelsIn;
  uStack_70._4_4_ = pConfig->channelsOut;
  pConverter->formatIn = (undefined4)local_78;
  pConverter->formatOut = local_78._4_4_;
  pConverter->channelsIn = (ma_uint32)uStack_70;
  pConverter->channelsOut = uStack_70._4_4_;
  mVar3 = pConfig->sampleRateIn;
  pConverter->sampleRateIn = mVar3;
  mVar4 = pConfig->sampleRateOut;
  pConverter->sampleRateOut = mVar4;
  pConverter->ditherMode = pConfig->ditherMode;
  mVar5 = pConfig->allowDynamicSampleRate;
  mVar14 = ma_data_converter_config_get_mid_format(pConfig);
  local_60.format = ma_data_converter_config_get_mid_format(pConfig);
  local_60.channels = (ma_uint32)uStack_70;
  local_60.sampleRateIn = local_78._4_4_;
  local_60.sampleRateOut = 0;
  local_60.algorithm = (ma_resample_algorithm)pConfig->pChannelMapIn;
  local_60._20_4_ = SUB84((ulong)pConfig->pChannelMapIn >> 0x20,0);
  local_60.pBackendVTable._0_4_ = SUB84(pConfig->pChannelMapOut,0);
  local_60.pBackendVTable._4_4_ = (undefined4)((ulong)pConfig->pChannelMapOut >> 0x20);
  local_60.linear.lpfOrder = (ma_uint32)pConfig->ppChannelWeights;
  local_60._44_4_ = SUB84((ulong)pConfig->ppChannelWeights >> 0x20,0);
  uVar6 = pConfig->channelMixMode;
  uVar8 = pConfig->calculateLFEFromSpatialChannels;
  local_60.pBackendUserData._0_4_ = uVar6;
  local_60.pBackendUserData._4_4_ = uVar8;
  mVar13 = ma_channel_converter_init_preallocated
                     ((ma_channel_converter_config *)&local_60,
                      (void *)(local_90.channelConverterOffset + (long)pHeap),
                      &pConverter->channelConverter);
  if (mVar13 != MA_SUCCESS) {
    return mVar13;
  }
  if ((pConverter->channelConverter).conversionPath != ma_channel_conversion_path_passthrough) {
    pConverter->hasChannelConverter = '\x01';
  }
  if (mVar3 != mVar4 || mVar5 != 0) {
    uVar10 = pConfig->channelsOut;
    if (pConfig->channelsIn < pConfig->channelsOut) {
      uVar10 = pConfig->channelsIn;
    }
    local_60.format = ma_data_converter_config_get_mid_format(pConfig);
    local_60.algorithm = (pConfig->resampling).algorithm;
    local_60._20_4_ = 0;
    uVar7 = pConfig->sampleRateIn;
    uVar9 = pConfig->sampleRateOut;
    local_60._44_4_ = 0;
    local_60.linear.lpfOrder = (pConfig->resampling).linear.lpfOrder;
    pmVar11 = (pConfig->resampling).pBackendVTable;
    pvVar12 = (pConfig->resampling).pBackendUserData;
    local_60.pBackendVTable._0_4_ = SUB84(pmVar11,0);
    local_60.pBackendVTable._4_4_ = (undefined4)((ulong)pmVar11 >> 0x20);
    local_60.pBackendUserData._0_4_ = SUB84(pvVar12,0);
    local_60.pBackendUserData._4_4_ = (undefined4)((ulong)pvVar12 >> 0x20);
    local_60.channels = uVar10;
    local_60.sampleRateIn = uVar7;
    local_60.sampleRateOut = uVar9;
    mVar13 = ma_resampler_init_preallocated
                       (&local_60,(void *)((long)pHeap + local_90.resamplerOffset),
                        &pConverter->resampler);
    if (mVar13 != MA_SUCCESS) {
      return mVar13;
    }
    pConverter->hasResampler = '\x01';
  }
  mVar1 = pConverter->hasChannelConverter;
  if ((mVar1 == '\0') && (pConverter->hasResampler == '\0')) {
    pConverter->hasPreFormatConversion = '\0';
    if (pConverter->formatIn == pConverter->formatOut) {
      pConverter->hasPostFormatConversion = '\0';
      goto LAB_00164b67;
    }
  }
  else {
    if (pConverter->formatIn != mVar14) {
      pConverter->hasPreFormatConversion = '\x01';
    }
    if (pConverter->formatOut == mVar14) goto LAB_00164b67;
  }
  pConverter->hasPostFormatConversion = '\x01';
LAB_00164b67:
  if (((pConverter->hasPreFormatConversion == '\0') &&
      (pConverter->hasPostFormatConversion == '\0' && mVar1 == '\0')) &&
     (pConverter->hasResampler == '\0')) {
    pConverter->isPassthrough = '\x01';
  }
  if (pConverter->isPassthrough != '\0') {
    pConverter->executionPath = ma_data_converter_execution_path_passthrough;
    return MA_SUCCESS;
  }
  mVar2 = pConverter->hasResampler;
  if (pConverter->channelsIn < pConverter->channelsOut) {
    if (mVar2 != '\0') {
      pConverter->executionPath = ma_data_converter_execution_path_resample_first;
      return MA_SUCCESS;
    }
  }
  else {
    if (mVar1 == '\0') {
      if (mVar2 != '\0') {
        pConverter->executionPath = ma_data_converter_execution_path_resample_only;
        return MA_SUCCESS;
      }
      pConverter->executionPath = ma_data_converter_execution_path_format_only;
      return MA_SUCCESS;
    }
    if (mVar2 != '\0') {
      pConverter->executionPath = ma_data_converter_execution_path_channels_first;
      return MA_SUCCESS;
    }
  }
  pConverter->executionPath = ma_data_converter_execution_path_channels_only;
  return MA_SUCCESS;
}

Assistant:

MA_API ma_result ma_data_converter_init_preallocated(const ma_data_converter_config* pConfig, void* pHeap, ma_data_converter* pConverter)
{
    ma_result result;
    ma_data_converter_heap_layout heapLayout;
    ma_format midFormat;
    ma_bool32 isResamplingRequired;

    if (pConverter == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pConverter);

    result = ma_data_converter_get_heap_layout(pConfig, &heapLayout);
    if (result != MA_SUCCESS) {
        return result;
    }

    pConverter->_pHeap = pHeap;
    MA_ZERO_MEMORY(pHeap, heapLayout.sizeInBytes);

    pConverter->formatIn      = pConfig->formatIn;
    pConverter->formatOut     = pConfig->formatOut;
    pConverter->channelsIn    = pConfig->channelsIn;
    pConverter->channelsOut   = pConfig->channelsOut;
    pConverter->sampleRateIn  = pConfig->sampleRateIn;
    pConverter->sampleRateOut = pConfig->sampleRateOut;
    pConverter->ditherMode    = pConfig->ditherMode;

    /*
    Determine if resampling is required. We need to do this so we can determine an appropriate
    mid format to use. If resampling is required, the mid format must be ma_format_f32 since
    that is the only one that is guaranteed to supported by custom resampling backends.
    */
    isResamplingRequired = ma_data_converter_config_is_resampler_required(pConfig);
    midFormat = ma_data_converter_config_get_mid_format(pConfig);


    /* Channel converter. We always initialize this, but we check if it configures itself as a passthrough to determine whether or not it's needed. */
    {
        ma_channel_converter_config channelConverterConfig = ma_channel_converter_config_init_from_data_converter_config(pConfig);

        result = ma_channel_converter_init_preallocated(&channelConverterConfig, ma_offset_ptr(pHeap, heapLayout.channelConverterOffset), &pConverter->channelConverter);
        if (result != MA_SUCCESS) {
            return result;
        }

        /* If the channel converter is not a passthrough we need to enable it. Otherwise we can skip it. */
        if (pConverter->channelConverter.conversionPath != ma_channel_conversion_path_passthrough) {
            pConverter->hasChannelConverter = MA_TRUE;
        }
    }


    /* Resampler. */
    if (isResamplingRequired) {
        ma_resampler_config resamplerConfig = ma_resampler_config_init_from_data_converter_config(pConfig);

        result = ma_resampler_init_preallocated(&resamplerConfig, ma_offset_ptr(pHeap, heapLayout.resamplerOffset), &pConverter->resampler);
        if (result != MA_SUCCESS) {
            return result;
        }

        pConverter->hasResampler = MA_TRUE;
    }


    /* We can simplify pre- and post-format conversion if we have neither channel conversion nor resampling. */
    if (pConverter->hasChannelConverter == MA_FALSE && pConverter->hasResampler == MA_FALSE) {
        /* We have neither channel conversion nor resampling so we'll only need one of pre- or post-format conversion, or none if the input and output formats are the same. */
        if (pConverter->formatIn == pConverter->formatOut) {
            /* The formats are the same so we can just pass through. */
            pConverter->hasPreFormatConversion  = MA_FALSE;
            pConverter->hasPostFormatConversion = MA_FALSE;
        } else {
            /* The formats are different so we need to do either pre- or post-format conversion. It doesn't matter which. */
            pConverter->hasPreFormatConversion  = MA_FALSE;
            pConverter->hasPostFormatConversion = MA_TRUE;
        }
    } else {
        /* We have a channel converter and/or resampler so we'll need channel conversion based on the mid format. */
        if (pConverter->formatIn != midFormat) {
            pConverter->hasPreFormatConversion  = MA_TRUE;
        }
        if (pConverter->formatOut != midFormat) {
            pConverter->hasPostFormatConversion = MA_TRUE;
        }
    }

    /* We can enable passthrough optimizations if applicable. Note that we'll only be able to do this if the sample rate is static. */
    if (pConverter->hasPreFormatConversion  == MA_FALSE &&
        pConverter->hasPostFormatConversion == MA_FALSE &&
        pConverter->hasChannelConverter     == MA_FALSE &&
        pConverter->hasResampler            == MA_FALSE) {
        pConverter->isPassthrough = MA_TRUE;
    }


    /* We now need to determine our execution path. */
    if (pConverter->isPassthrough) {
        pConverter->executionPath = ma_data_converter_execution_path_passthrough;
    } else {
        if (pConverter->channelsIn < pConverter->channelsOut) {
            /* Do resampling first, if necessary. */
            MA_ASSERT(pConverter->hasChannelConverter == MA_TRUE);

            if (pConverter->hasResampler) {
                pConverter->executionPath = ma_data_converter_execution_path_resample_first;
            } else {
                pConverter->executionPath = ma_data_converter_execution_path_channels_only;
            }
        } else {
            /* Do channel conversion first, if necessary. */
            if (pConverter->hasChannelConverter) {
                if (pConverter->hasResampler) {
                    pConverter->executionPath = ma_data_converter_execution_path_channels_first;
                } else {
                    pConverter->executionPath = ma_data_converter_execution_path_channels_only;
                }
            } else {
                /* Channel routing not required. */
                if (pConverter->hasResampler) {
                    pConverter->executionPath = ma_data_converter_execution_path_resample_only;
                } else {
                    pConverter->executionPath = ma_data_converter_execution_path_format_only;
                }
            }
        }
    }

    return MA_SUCCESS;
}